

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O3

int Aig_CutMerge(Aig_ManCut_t *p,Aig_Cut_t *pCut0,Aig_Cut_t *pCut1,Aig_Cut_t *pCut)

{
  int iVar1;
  Aig_Cut_t *pC1;
  Aig_Cut_t *pC0;
  
  if (p->nLeafMax < 1) {
    __assert_fail("p->nLeafMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigCuts.c"
                  ,0x1fd,"int Aig_CutMerge(Aig_ManCut_t *, Aig_Cut_t *, Aig_Cut_t *, Aig_Cut_t *)");
  }
  pC1 = pCut1;
  pC0 = pCut0;
  if (pCut0->nFanins < pCut1->nFanins) {
    pC1 = pCut0;
    pC0 = pCut1;
  }
  iVar1 = Aig_CutMergeOrdered(p,pC0,pC1,pCut);
  if (iVar1 != 0) {
    pCut->uSign = pCut1->uSign | pCut0->uSign;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int Aig_CutMerge( Aig_ManCut_t * p, Aig_Cut_t * pCut0, Aig_Cut_t * pCut1, Aig_Cut_t * pCut )
{ 
    assert( p->nLeafMax > 0 );
    // merge the nodes
    if ( pCut0->nFanins < pCut1->nFanins )
    {
        if ( !Aig_CutMergeOrdered( p, pCut1, pCut0, pCut ) )
            return 0;
    }
    else
    {
        if ( !Aig_CutMergeOrdered( p, pCut0, pCut1, pCut ) )
            return 0;
    }
    pCut->uSign = pCut0->uSign | pCut1->uSign;
    return 1;
}